

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.h
# Opt level: O0

void __thiscall Am_Assoc_Data::Am_Assoc_Data(Am_Assoc_Data *this,Am_Assoc_Data *proto)

{
  Am_Assoc_Data *proto_local;
  Am_Assoc_Data *this_local;
  
  Am_Wrapper::Am_Wrapper(&this->super_Am_Wrapper);
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_00411130;
  Am_Value::Am_Value(&this->value_1);
  Am_Value::Am_Value(&this->value_2);
  Am_Value::operator=(&this->value_1,&proto->value_1);
  Am_Value::operator=(&this->value_2,&proto->value_2);
  return;
}

Assistant:

Am_Assoc_Data(Am_Assoc_Data *proto) //required by wrapper
  {
    value_1 = proto->value_1;
    value_2 = proto->value_2;
  }